

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<Qt::Key>::begin(QList<Qt::Key> *this)

{
  Key *n;
  QArrayDataPointer<Qt::Key> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<Qt::Key> *)0x50a5b9);
  QArrayDataPointer<Qt::Key>::operator->(in_RDI);
  n = QArrayDataPointer<Qt::Key>::begin((QArrayDataPointer<Qt::Key> *)0x50a5ca);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }